

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

OrderedArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedArgumentSyntax,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,PropertyExprSyntax *args)

{
  OrderedArgumentSyntax *pOVar1;
  
  pOVar1 = (OrderedArgumentSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((OrderedArgumentSyntax *)this->endPtr < pOVar1 + 1) {
    pOVar1 = (OrderedArgumentSyntax *)allocateSlow(this,0x18,8);
  }
  else {
    this->head->current = (byte *)(pOVar1 + 1);
  }
  (pOVar1->super_ArgumentSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pOVar1->super_ArgumentSyntax).super_SyntaxNode.kind = OrderedArgument;
  (pOVar1->expr).ptr = args;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pOVar1;
  return pOVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }